

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::getp_append
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  CVmObjStringBuffer *this_00;
  vm_val_t *pvVar2;
  vm_strbuf_ext *pvVar3;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  char *str;
  vm_val_t strval;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int32_t bytes;
  uint *in_stack_ffffffffffffffa0;
  char *src;
  undefined8 local_48;
  anon_union_8_8_cb74652f_for_val local_40;
  undefined4 in_stack_ffffffffffffffe8;
  vm_obj_id_t obj;
  
  if ((getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_append::desc,1);
    __cxa_guard_release(&getp_append(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,in_stack_ffffffffffffffa0,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar1 == 0) {
    CVmStack::get(0);
    this_00 = (CVmObjStringBuffer *)
              vm_val_t::cast_to_string
                        ((vm_val_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
    pvVar2 = CVmStack::get(0);
    *(undefined8 *)pvVar2 = local_48;
    pvVar2->val = local_40;
    obj = in_ESI;
    pvVar3 = get_ext((CVmObjStringBuffer *)in_RDI);
    bytes = pvVar3->len;
    src = (char *)((long)&(this_00->super_CVmObject)._vptr_CVmObject + 2);
    vmb_get_len((char *)0x335685);
    insert_text(this_00,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,src,bytes,in_ESI);
    CVmStack::discard();
    vm_val_t::set_obj(in_RDX,obj);
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_append(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get or cast the string; leave it on the stack for gc protection */
    vm_val_t strval;
    const char *str = G_stk->get(0)->cast_to_string(vmg_ &strval);
    *G_stk->get(0) = strval;

    /* insert the string at the end of the buffer */
    insert_text(vmg_ self, get_ext()->len,
                str + VMB_LEN, vmb_get_len(str), TRUE);

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    retval->set_obj(self);
    return TRUE;
}